

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  pointer pMVar1;
  cmCommand *pcVar2;
  bool bVar3;
  ostream *poVar4;
  mode_t *permissions;
  string regex;
  ostringstream e;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  switch(this->Doing) {
  case 2:
    if ((arg->_M_string_length == 0) || (bVar3 = cmsys::SystemTools::FileIsFullPath(arg), bVar3)) {
      std::__cxx11::string::_M_assign((string *)&this->Destination);
    }
    else {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::_M_assign((string *)&this->Destination);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "/",arg);
      std::__cxx11::string::_M_append((char *)&this->Destination,local_198._0_8_);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
    }
    break;
  case 3:
    bVar3 = cmsys::SystemTools::FileIsFullPath(arg);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&this->FilesFromDir);
    }
    else {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::_M_assign((string *)&this->FilesFromDir);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "/",arg);
      std::__cxx11::string::_M_append((char *)&this->FilesFromDir,local_198._0_8_);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&this->FilesFromDir);
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,arg);
    return true;
  case 5:
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/","");
    cmsys::Glob::PatternToRegex((string *)local_198,arg,false,false);
    std::__cxx11::string::_M_append((char *)&local_1d8,local_198._0_8_);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_1d8);
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,&local_1d8);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"could not compile PATTERN \"",0x1b);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
    }
    else {
      this->Doing = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
      return true;
    }
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    return true;
  case 6:
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,arg);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"could not compile REGEX \"",0x19);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      return true;
    }
    break;
  case 7:
    permissions = &this->FilePermissions;
    goto LAB_002e95c5;
  case 8:
    permissions = &this->DirPermissions;
    goto LAB_002e95c5;
  case 9:
    permissions = &(this->CurrentMatchRule->Properties).Permissions;
LAB_002e95c5:
    bVar3 = CheckPermissions(this,arg,permissions);
    if (!bVar3) {
      this->Doing = 1;
      return true;
    }
    return true;
  default:
    return false;
  }
  this->Doing = 0;
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch (this->Doing) {
    case DoingFiles:
      this->Files.push_back(arg);
      break;
    case DoingDestination:
      if (arg.empty() || cmSystemTools::FileIsFullPath(arg)) {
        this->Destination = arg;
      } else {
        this->Destination = this->Makefile->GetCurrentBinaryDirectory();
        this->Destination += "/" + arg;
      }
      this->Doing = DoingNone;
      break;
    case DoingFilesFromDir:
      if (cmSystemTools::FileIsFullPath(arg)) {
        this->FilesFromDir = arg;
      } else {
        this->FilesFromDir = this->Makefile->GetCurrentSourceDirectory();
        this->FilesFromDir += "/" + arg;
      }
      cmSystemTools::ConvertToUnixSlashes(this->FilesFromDir);
      this->Doing = DoingNone;
      break;
    case DoingPattern: {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex = "/";
      regex += cmsys::Glob::PatternToRegex(arg, false);
      regex += "$";
      this->MatchRules.emplace_back(regex);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
      }
    } break;
    case DoingRegex:
      this->MatchRules.emplace_back(arg);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsFile:
      if (!this->CheckPermissions(arg, this->FilePermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsDir:
      if (!this->CheckPermissions(arg, this->DirPermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsMatch:
      if (!this->CheckPermissions(
            arg, this->CurrentMatchRule->Properties.Permissions)) {
        this->Doing = DoingError;
      }
      break;
    default:
      return false;
  }
  return true;
}